

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O0

void test_pass_lvalue(void)

{
  int iVar1;
  assertion_failed *paVar2;
  int *piVar3;
  undefined1 local_40 [8];
  small_function<int_&(int_&),_8UL,_8UL> fn2;
  int local_20 [2];
  int x;
  small_function<int_(int),_8UL,_8UL> fn;
  
  avakar::small_function<int_(int),_8UL,_8UL>::impl((small_function<int_(int),_8UL,_8UL> *)&x);
  local_20[0] = 1;
  iVar1 = avakar::_small_function::impl<8UL,_8UL,_false,_int,_int>::operator()
                    ((impl<8UL,_8UL,_false,_int,_int> *)&x,1);
  if (iVar1 != 1) {
    paVar2 = (assertion_failed *)__cxa_allocate_exception(0x10);
    assertion_failed::runtime_error
              (paVar2,
               "/workspace/llm4binary/github/license_c_cmakelists/avakar[P]small_function/test/test.cpp(152): assertion failed: fn(x) == 1"
              );
    __cxa_throw(paVar2,&assertion_failed::typeinfo,assertion_failed::~assertion_failed);
  }
  avakar::small_function<int_&(int_&),_8UL,_8UL>::impl
            ((small_function<int_&(int_&),_8UL,_8UL> *)local_40);
  piVar3 = avakar::_small_function::impl<8UL,_8UL,_false,_int_&,_int_&>::operator()
                     ((impl<8UL,_8UL,_false,_int_&,_int_&> *)local_40,local_20);
  if (piVar3 != local_20) {
    paVar2 = (assertion_failed *)__cxa_allocate_exception(0x10);
    assertion_failed::runtime_error
              (paVar2,
               "/workspace/llm4binary/github/license_c_cmakelists/avakar[P]small_function/test/test.cpp(155): assertion failed: &fn2(x) == &x"
              );
    __cxa_throw(paVar2,&assertion_failed::typeinfo,assertion_failed::~assertion_failed);
  }
  avakar::small_function<int_&(int_&),_8UL,_8UL>::~small_function
            ((small_function<int_&(int_&),_8UL,_8UL> *)local_40);
  avakar::small_function<int_(int),_8UL,_8UL>::~small_function
            ((small_function<int_(int),_8UL,_8UL> *)&x);
  return;
}

Assistant:

static void test_pass_lvalue()
{
	small_function<int (int)> fn = [](int x) { return x; };

	int x = 1;
	require(fn(x) == 1);

	small_function<int &(int &)> fn2 = [](int & x) -> int & { return x; };
	require(&fn2(x) == &x);
}